

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode do_init_stack(Curl_easy *data)

{
  CURLcode CVar1;
  Curl_cwriter *pCVar2;
  
  CVar1 = Curl_cwriter_create(&(data->req).writer_stack,data,&cw_client,CURL_CW_CLIENT);
  if (CVar1 == CURLE_OK) {
    pCVar2 = (Curl_cwriter *)(*Curl_ccalloc)(1,0x18);
    if (pCVar2 == (Curl_cwriter *)0x0) {
      CVar1 = CURLE_OUT_OF_MEMORY;
      pCVar2 = (Curl_cwriter *)0x0;
    }
    else {
      pCVar2->cwt = &cw_download;
      pCVar2->phase = CURL_CW_PROTOCOL;
      CVar1 = Curl_cwriter_add(data,pCVar2);
      if (CVar1 != CURLE_OK) {
        (*pCVar2->cwt->do_close)(data,pCVar2);
        (*Curl_cfree)(pCVar2);
      }
      pCVar2 = (Curl_cwriter *)(*Curl_ccalloc)(1,0x18);
      if (pCVar2 == (Curl_cwriter *)0x0) {
        CVar1 = CURLE_OUT_OF_MEMORY;
      }
      else {
        pCVar2->cwt = &cw_raw;
        pCVar2->phase = CURL_CW_RAW;
        CVar1 = Curl_cwriter_add(data,pCVar2);
        if (CVar1 == CURLE_OK) {
          return CURLE_OK;
        }
        (*pCVar2->cwt->do_close)(data,pCVar2);
      }
    }
    (*Curl_cfree)(pCVar2);
  }
  return CVar1;
}

Assistant:

static CURLcode do_init_stack(struct Curl_easy *data)
{
  struct Curl_cwriter *writer;
  CURLcode result;

  DEBUGASSERT(!data->req.writer_stack);
  result = Curl_cwriter_create(&data->req.writer_stack,
                               data, &cw_client, CURL_CW_CLIENT);
  if(result)
    return result;

  result = Curl_cwriter_create(&writer, data, &cw_download, CURL_CW_PROTOCOL);
  if(result)
    return result;
  result = Curl_cwriter_add(data, writer);
  if(result) {
    Curl_cwriter_free(data, writer);
  }

  result = Curl_cwriter_create(&writer, data, &cw_raw, CURL_CW_RAW);
  if(result)
    return result;
  result = Curl_cwriter_add(data, writer);
  if(result) {
    Curl_cwriter_free(data, writer);
  }
  return result;
}